

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

size_t __thiscall HFSubConsumer::available(HFSubConsumer *this,long timeout)

{
  size_t sVar1;
  long in_RSI;
  long in_RDI;
  uint64_t avail;
  int i;
  timespec t;
  size_t num;
  ConcurrentQueue<_zframe_t_*,_MyTraits> *in_stack_ffffffffffffffc0;
  int local_34;
  timespec local_30;
  size_t local_20;
  long local_18;
  size_t local_8;
  
  local_18 = in_RSI;
  local_20 = moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::size_approx
                       (in_stack_ffffffffffffffc0);
  local_8 = local_20;
  if ((local_20 == 0) && (local_18 != 0)) {
    if (local_18 == 1) {
      local_30.tv_sec = 0;
      local_30.tv_nsec = 0x30958;
      for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
        clock_nanosleep(1,1,&local_30,(timespec *)0x0);
        sVar1 = moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::size_approx
                          (in_stack_ffffffffffffffc0);
        if (sVar1 != 0) {
          return sVar1;
        }
        local_20 = 0;
      }
    }
    else {
      zmq_poll(*(undefined8 *)(in_RDI + 0x3b8),1,0);
      if ((*(ushort *)(*(long *)(in_RDI + 0x3b8) + 0xe) & 1) != 0) {
        zsock_brecv(*(void **)(in_RDI + 0x380),"8",&stack0xffffffffffffffc0);
      }
      zstr_send(*(void **)(in_RDI + 0x380),"$WT");
      zmq_poll(*(undefined8 *)(in_RDI + 0x3b8),1,local_18);
      if ((*(ushort *)(*(long *)(in_RDI + 0x3b8) + 0xe) & 1) != 0) {
        zsock_brecv(*(void **)(in_RDI + 0x380),"8",&stack0xffffffffffffffc0);
        return (size_t)in_stack_ffffffffffffffc0;
      }
    }
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

size_t HFSubConsumer::available(long timeout){
    /* attempts at optimization:
     * 1. if timeout is 0ms, don't even send out polling request
     * 2. if timeout is 1ms, don't bother sending out polling req, but check queue 4 times
     *      - this way, worst case added latency is ~0.25ms
     * 3. else, clear the req-rep polls, send a wait request to other thread
     */ 
    size_t num = framequeue.size_approx();
    if(num || timeout == 0){
        return num;
    }
#ifdef __linux__
    else if(timeout == 1){
        const struct timespec t = {0, 199*1000};
        for(int i=0; i<5;i++){
            clock_nanosleep(CLOCK_MONOTONIC, TIMER_ABSTIME, &t, NULL);
            if((num=framequeue.size_approx())){
                return num;
            }
        }
    }
#endif
    else{
        uint64_t avail;
        //Polling could have timed out last time. First check if there is a message waiting to be grabbed.
        //If there is, it must be an old value since the framequeue size we got was 0. Toss it and try again.
        zmq_poll(pollitem, 1, 0);
        if(pollitem->revents & ZMQ_POLLIN){
            zsock_brecv(req, "8", &avail);
        }

        //Request again after clearing any messages.
        zstr_send(req, waittimeout);
        zmq_poll(pollitem, 1, timeout);
        if(pollitem->revents & ZMQ_POLLIN){
            zsock_brecv(req, "8", &avail);
            return avail;
        }
    }